

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_variable_initializer
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  bool bVar1;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  undefined8 local_68;
  allocator<char> local_49;
  string local_48;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_28;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  node = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  this_00 = std::
            unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
            operator->(parent);
  local_28 = ast_node::add_child(this_00,VARIABLE_INITIALIZER);
  bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_ASSIGN);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_49);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"\'=\' expected");
    local_68 = 1;
    args._M_len = 1;
    args._M_array = &local_80;
    local_70 = &local_80;
    this_local._7_1_ = process_failover(this,&local_48,0x1b6,args,true);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    next(this);
    bVar1 = parse_expression(this,local_28);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ast::parse_variable_initializer(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(VARIABLE_INITIALIZER);

    if (cur_token != tokenizer::TK_ASSIGN) {
        return failover({"'=' expected"});
    }
    next();

    if (!parse_expression(node)) {
        return false;
    }

    return true;
}